

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_emit_x86.h
# Opt level: O2

void emit_loadu64(ASMState *as,Reg r,uint64_t u64)

{
  byte bVar1;
  MCode *p;
  MCode *pMVar2;
  int i;
  long lVar3;
  Reg RStack_8;
  
  bVar1 = (byte)r;
  i = (int)u64;
  if (u64 >> 0x20 == 0) {
    emit_loadi(as,r,i);
    return;
  }
  if ((long)i == u64) {
    pMVar2 = as->mcp;
    *(int *)(pMVar2 + -4) = i;
    pMVar2[-5] = bVar1 & 7 | 0xc0;
    pMVar2[-6] = 199;
    pMVar2[-7] = bVar1 >> 3 & 1 | 0x48;
    pMVar2 = pMVar2 + -7;
LAB_00137f72:
    as->mcp = pMVar2;
    return;
  }
  lVar3 = (u64 - (long)as->J) + -0xca8;
  if ((int)lVar3 == lVar3) {
    RStack_8 = 0xe;
  }
  else {
    pMVar2 = as->mcp;
    lVar3 = u64 - (long)pMVar2;
    if (((int)lVar3 != lVar3) || ((u64 + 0x80000000) - (long)as->mctop >> 0x20 != 0)) {
      *(uint64_t *)(pMVar2 + -8) = u64;
      pMVar2[-9] = bVar1 & 7 | 0xb8;
      pMVar2[-10] = bVar1 >> 3 & 1 | 0x48;
      pMVar2 = pMVar2 + -10;
      goto LAB_00137f72;
    }
    RStack_8 = 0x25;
  }
  emit_rmro(as,XO_LEA,r | 0x80200,RStack_8,(int32_t)lVar3);
  return;
}

Assistant:

static void emit_loadu64(ASMState *as, Reg r, uint64_t u64)
{
  if (checku32(u64)) {  /* 32 bit load clears upper 32 bits. */
    emit_loadi(as, r, (int32_t)u64);
  } else if (checki32((int64_t)u64)) {  /* Sign-extended 32 bit load. */
    MCode *p = as->mcp;
    *(int32_t *)(p-4) = (int32_t)u64;
    as->mcp = emit_opm(XO_MOVmi, XM_REG, REX_64, r, p, -4);
#if LJ_GC64
  } else if (checki32(dispofs(as, u64))) {
    emit_rmro(as, XO_LEA, r|REX_64, RID_DISPATCH, (int32_t)dispofs(as, u64));
  } else if (checki32(mcpofs(as, u64)) && checki32(mctopofs(as, u64))) {
    /* Since as->realign assumes the code size doesn't change, check
    ** RIP-relative addressing reachability for both as->mcp and as->mctop.
    */
    emit_rmro(as, XO_LEA, r|REX_64, RID_RIP, (int32_t)mcpofs(as, u64));
#endif
  } else {  /* Full-size 64 bit load. */
    MCode *p = as->mcp;
    *(uint64_t *)(p-8) = u64;
    p[-9] = (MCode)(XI_MOVri+(r&7));
    p[-10] = 0x48 + ((r>>3)&1);
    p -= 10;
    as->mcp = p;
  }
}